

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntConstMath.cpp
# Opt level: O1

bool IntConstMath::IsValid(IntConstType val,IRType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined7 in_register_00000031;
  
  bVar2 = true;
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 3:
  case 7:
    bVar2 = (int)val == val;
    break;
  case 4:
  case 8:
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntConstMath.cpp"
                       ,0x1b,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IntConstMath::IsValid(IntConstType val, IRType type)
{
    switch (type)
    {
#if TARGET_32
    case TyInt32:
    case TyUint32:
        CompileAssert(sizeof(IntConstType) == sizeof(int32));
        return true;
#elif TARGET_64
    case TyInt32:
    case TyUint32:
        return Math::FitsInDWord(val);
    case TyInt64:
    case TyUint64:
        CompileAssert(sizeof(IntConstType) == sizeof(int64));
        return true;
#endif
    default:
        Assert(UNREACHED);
        return false;
    }
}